

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22f865::mock_region_factory::add
          (mock_region_factory *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  uint64_t minimum_size;
  ulong __length;
  ulong uVar1;
  char *__file;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> builder;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_60;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> local_50;
  
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,
             &(this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (original_size <= new_size) {
    minimum_size = (this->super_factory).min_size_;
    std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&local_70);
    pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
    region_builder(&local_50,(shared_ptr<pstore::file::in_memory> *)&local_60,
                   (this->super_factory).full_size_,minimum_size);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    uVar1 = (new_size + minimum_size) - 1;
    __length = uVar1 % minimum_size;
    __file = (char *)(uVar1 - __length);
    pstore::file::in_memory::truncate(local_70._M_ptr,__file,__length);
    pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
    append(&local_50,regions,original_size,(long)__file - original_size);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.file_.
                super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    return;
  }
  pstore::assert_failed
            ("new_size >= original_size",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
             ,0x111);
}

Assistant:

void add (pstore::gsl::not_null<std::vector<pstore::region::memory_mapper_ptr> *> regions,
                  std::uint64_t original_size, std::uint64_t new_size) override {
            this->append<pstore::file::in_memory, mock_mapper> (file_, regions, original_size,
                                                                new_size);
        }